

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

TagBit * __thiscall Qentem::Array<Qentem::Tags::TagBit>::allocate(Array<Qentem::Tags::TagBit> *this)

{
  SizeT size;
  TagBit *ptr;
  TagBit *new_storage;
  Array<Qentem::Tags::TagBit> *this_local;
  
  size = Capacity(this);
  ptr = Memory::Allocate<Qentem::Tags::TagBit>(size);
  setStorage(this,ptr);
  return ptr;
}

Assistant:

Type_T *allocate() {
        Type_T *new_storage = Memory::Allocate<Type_T>(Capacity());
        setStorage(new_storage);
        return new_storage;
    }